

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacheck.hpp
# Opt level: O1

ostream * __thiscall
mc::detail::
section_result<std::tuple<mc::detail::section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>,_const_mc::detail::section_base_*>_>
::print(section_result<std::tuple<mc::detail::section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>,_const_mc::detail::section_base_*>_>
        *this,ostream *stream,string *test_root)

{
  pointer pcVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  string new_root;
  string local_88;
  long *local_68;
  long local_60;
  long local_58 [2];
  section_base *local_48;
  section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>
  local_40;
  
  pcVar1 = (test_root->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + test_root->_M_string_length);
  pcVar2 = (char *)std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[----------] ",0xd);
  (**(this->super_section_base)._vptr_section_base)(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests from ",0xc);
  pcVar2 = (this->super_section_base).name;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_60 + (long)local_68);
  local_48 = (this->results).
             super__Tuple_impl<0UL,_mc::detail::section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>,_const_mc::detail::section_base_*>
             .super__Tuple_impl<1UL,_const_mc::detail::section_base_*>.
             super__Head_base<1UL,_const_mc::detail::section_base_*,_false>._M_head_impl;
  local_40.super_section_base.name =
       (this->results).
       super__Tuple_impl<0UL,_mc::detail::section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>,_const_mc::detail::section_base_*>
       .
       super__Head_base<0UL,_mc::detail::section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>,_false>
       ._M_head_impl.super_section_base.name;
  local_40.super_section_base._vptr_section_base = (_func_int **)&PTR_num_tests_00107d20;
  section_result<std::tuple<mc::detail::error<testns::reverse_test,_10U,_10U,_5U,_mc::seed_state<17761409426447039303UL>,_kvasir::mpl::list<char[],_void_*>_>_>_>
  ::print(&local_40,stream,&local_88);
  (*local_48->_vptr_section_base[3])(local_48,stream,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[----------] ",0xd);
  (**(this->super_section_base)._vptr_section_base)(this);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests from ",0xc);
  pcVar2 = (this->super_section_base).name;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (0 ms total)",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return stream;
}

Assistant:

std::ostream &print(std::ostream &stream, std::string &test_root) const override {
				std::string new_root{test_root};
				new_root.append(name).append(".");
				// replace the root name with the current section for now
				stream << "[----------] " << num_tests() << " tests from " << name << std::endl;
				print_all_tuple(stream, new_root, results);
				stream << "[----------] " << num_tests() << " tests from " << name
				       << " (0 ms total)" << std::endl;
				return stream;
			}